

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

bool dxil_spv::emit_buffer_load_instruction(Impl *impl,CallInst *instruction)

{
  ResourceKind RVar1;
  StorageClass SVar2;
  Op op;
  bool bVar3;
  ComponentType element_type;
  byte bVar4;
  Id IVar5;
  RawWidth width;
  TypeID TVar6;
  Id IVar7;
  Id IVar8;
  CallInst *pCVar9;
  Builder *this;
  Value *pVVar10;
  mapped_type *pmVar11;
  LoggingCallback p_Var12;
  Type *pTVar13;
  Type *element_type_00;
  BufferAccessInfo BVar14;
  Operation *pOVar15;
  void *pvVar16;
  Operation *pOVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  uint32_t access_mask;
  long lVar22;
  Op OVar23;
  mapped_type *pmVar24;
  char cVar25;
  uint uVar26;
  ulong uVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  RawAccessChain RVar30;
  Id image_id;
  Id component_ids [4];
  char buffer [4096];
  Id local_109c;
  mapped_type *local_1098;
  CallInst *local_1090;
  Type *local_1088;
  mapped_type *local_1080;
  mapped_type *local_1078;
  Id local_1070;
  Id local_106c;
  Value local_1068;
  Type *local_1050;
  BufferAccessInfo local_1048;
  undefined1 local_1040 [8];
  Vector<spv::Id> local_1038;
  undefined1 uStack_1020;
  undefined2 uStack_101f;
  undefined5 uStack_101d;
  undefined1 uStack_1018;
  undefined2 uStack_1017;
  undefined6 uStack_1015;
  undefined2 uStack_100f;
  
  if (((impl->ags).num_instructions == 1) &&
     (pCVar9 = (CallInst *)LLVMBC::Instruction::getOperand(&instruction->super_Instruction,2),
     pCVar9 == (impl->ags).backdoor_instructions[0])) {
    pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
    IVar5 = Converter::Impl::get_id_for_value(impl,pVVar10,0);
    (impl->ags).active_uav_ptr = IVar5;
    (impl->ags).active_uav_op = BufferLoad;
    (impl->ags).active_read_backdoor = (Value *)instruction;
    return true;
  }
  bVar3 = Converter::Impl::composite_is_accessed(impl,(Value *)instruction);
  if (!bVar3) {
    return true;
  }
  this = Converter::Impl::builder(impl);
  access_mask = 1;
  pVVar10 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
  local_109c = Converter::Impl::get_id_for_value(impl,pVVar10,0);
  IVar5 = Converter::Impl::get_type_id(impl,local_109c);
  pmVar11 = std::__detail::
            _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&impl->handle_to_resource_meta,&local_109c);
  local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)instruction;
  local_1078 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)&local_1038);
  uVar20 = local_1078->access_mask;
  local_1098 = pmVar11;
  if ((pmVar11->storage != StorageClassUniformConstant) &&
     (uVar19 = (uVar20 & 0xf) >> 1 | uVar20 & 0xf, access_mask = uVar19 >> 2 | uVar19,
     pmVar11->storage == StorageClassPhysicalStorageBuffer)) {
    if ((uVar20 & 0x10) == 0) {
      bVar3 = emit_physical_buffer_load_instruction
                        (impl,instruction,&pmVar11->physical_pointer_meta,access_mask,4);
      return bVar3;
    }
    p_Var12 = get_thread_log_callback();
    if (p_Var12 == (LoggingCallback)0x0) {
      emit_buffer_load_instruction();
      return false;
    }
    uStack_1018 = 99;
    uStack_1017 = 0x2e6b;
    uStack_1015 = 0xa283a3e20;
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x737261707320646e;
    uStack_1020 = 0x65;
    uStack_101f = 0x6620;
    uStack_101d = 0x6162646565;
    uVar28._0_1_ = 's';
    uVar28._1_1_ = 'e';
    uVar28._2_1_ = ' ';
    uVar28._3_1_ = 'B';
    uVar29._0_1_ = 'D';
    uVar29._1_1_ = 'A';
    uVar29._2_1_ = ' ';
    uVar29._3_1_ = 'a';
LAB_0017384d:
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x7520746f6e6e6143;
    local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)CONCAT44(uVar29,uVar28);
    pvVar16 = get_thread_log_callback_userdata();
    (*p_Var12)(pvVar16,Error,(char *)&local_1038);
    return false;
  }
  emit_buffer_synchronization_validation(impl,instruction,Load);
  if (((impl->options).nv_raw_access_chains == true) &&
     ((local_1098->storage == StorageClassPhysicalStorageBuffer ||
      local_1098->storage == StorageClassStorageBuffer) && (char)((uVar20 & 0x10) >> 4) == '\0')) {
    pTVar13 = LLVMBC::Value::getType((Value *)instruction);
    uVar20 = 0;
    pTVar13 = LLVMBC::Type::getStructElementType(pTVar13,0);
    uVar26 = 1;
    do {
      uVar19 = uVar20 & 0x1f;
      uVar20 = uVar20 + 1;
      if ((local_1078->access_mask >> uVar19 & 1) != 0) {
        uVar26 = uVar20;
      }
    } while (uVar20 != 4);
    RVar30 = emit_raw_access_chain(impl,local_1098,instruction,pTVar13,uVar26);
    pOVar15 = Converter::Impl::allocate(impl,OpLoad,(Value *)instruction,RVar30.vector_type_id);
    Operation::add_id(pOVar15,RVar30.ptr_id);
    Operation::add_literal(pOVar15,2);
    Operation::add_literal(pOVar15,RVar30.alignment);
    Converter::Impl::add(impl,pOVar15,false);
    bVar3 = type_is_16bit(pTVar13);
    if (((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) &&
       ((impl->options).min_precision_prefer_native_16bit == true)) {
      TVar6 = LLVMBC::Type::getTypeID(pTVar13);
      bVar3 = TVar6 == HalfTyID;
      IVar5 = Converter::Impl::get_type_id(impl,bVar3 * '\x05' + U16,1,uVar26,false);
      pOVar17 = Converter::Impl::allocate(impl,bVar3 + 0x71 + (uint)bVar3,IVar5);
      Operation::add_id(pOVar17,pOVar15->id);
      Converter::Impl::add(impl,pOVar17,false);
      Converter::Impl::rewrite_value(impl,(Value *)instruction,pOVar17->id);
    }
  }
  else {
    local_1080 = (mapped_type *)CONCAT44(local_1080._4_4_,IVar5);
    pTVar13 = LLVMBC::Value::getType((Value *)instruction);
    element_type_00 = LLVMBC::Type::getStructElementType(pTVar13,0);
    pmVar11 = local_1098;
    RVar1 = local_1098->kind;
    IVar5 = local_1098->index_offset_id;
    local_1050 = pTVar13;
    pTVar13 = LLVMBC::Type::getStructElementType(pTVar13,0);
    local_1090 = instruction;
    BVar14 = build_buffer_access(impl,instruction,0,IVar5,pTVar13,access_mask);
    uVar27 = (ulong)BVar14 >> 0x20;
    uVar19._0_1_ = (impl->execution_mode_meta).native_16bit_operations;
    uVar19._1_1_ = (impl->execution_mode_meta).synthesize_2d_quad_dispatch;
    uVar19._2_1_ = (impl->execution_mode_meta).synthesize_dummy_derivatives;
    uVar19._3_1_ = (impl->execution_mode_meta).field_0x33;
    local_1048 = BVar14;
    width = get_buffer_access_bits_per_component
                      ((Impl *)(ulong)uVar19,pmVar11->storage,element_type_00);
    local_1088 = element_type_00;
    TVar6 = LLVMBC::Type::getTypeID(element_type_00);
    local_109c = get_buffer_alias_handle
                           (impl,pmVar11,local_109c,(uint)(TVar6 == DoubleTyID),width,
                            BVar14.raw_vec_size);
    if ((uVar20 & 0x10) != 0) {
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)CONCAT44(local_1038.
                             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                             ._M_impl.super__Vector_impl_data._M_start._4_4_,0x29);
      std::
      _Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
      ::_M_insert_unique<spv::Capability_const&>
                ((_Rb_tree<spv::Capability,spv::Capability,std::_Identity<spv::Capability>,std::less<spv::Capability>,dxil_spv::ThreadLocalAllocator<spv::Capability>>
                  *)&this->capabilities,(Capability *)&local_1038);
    }
    if (RVar1 == TypedBuffer) {
      bVar3 = spv::Builder::isStorageImageType(this,(Id)local_1080);
      element_type = Converter::Impl::get_effective_typed_resource_type(pmVar11->component_type);
      IVar5 = Converter::Impl::get_type_id(impl,element_type,1,4,false);
      pCVar9 = local_1090;
      if ((uVar20 & 0x10) == 0) {
        pOVar15 = Converter::Impl::allocate
                            (impl,(uint)bVar3 + (uint)bVar3 * 2 + OpImageFetch,(Value *)local_1090,
                             IVar5);
        pTVar13 = LLVMBC::Value::getType((Value *)pCVar9);
        pTVar13 = LLVMBC::Type::getStructElementType(pTVar13,0);
        Converter::Impl::decorate_relaxed_precision(impl,pTVar13,pOVar15->id,true);
      }
      else {
        IVar7 = spv::Builder::makeIntegerType(this,0x20,false);
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             local_1038.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start + 2;
        *local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
         _M_impl.super__Vector_impl_data._M_start = IVar7;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start[1] = IVar5;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1038.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        IVar5 = Converter::Impl::get_struct_type(impl,&local_1038,0,"SparseTexel");
        pCVar9 = local_1090;
        if (local_1038.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (Id *)0x0) {
          free_in_thread(local_1038.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
        OVar23 = OpImageSparseFetch;
        if (bVar3) {
          OVar23 = OpImageSparseRead;
        }
        pOVar15 = Converter::Impl::allocate(impl,OVar23,(Value *)pCVar9,IVar5);
      }
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)&local_1068;
      local_1068.type = (Type *)CONCAT44(local_1048.index_id,local_109c);
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x2;
      Operation::add_ids(pOVar15,(initializer_list<unsigned_int> *)&local_1038);
      pmVar11 = local_1098;
      Converter::Impl::add(impl,pOVar15,local_1098->rov);
      if ((uVar20 & 0x10) != 0) {
        Converter::Impl::repack_sparse_feedback
                  (impl,pmVar11->component_type,4,(Value *)pCVar9,local_1088,0);
        return true;
      }
      Converter::Impl::fixup_load_type_typed
                (impl,pmVar11->component_type,4,(Value *)pCVar9,local_1088);
      build_exploded_composite_from_vector(impl,&pCVar9->super_Instruction,4);
      return true;
    }
    uVar26 = BVar14.raw_vec_size + V2;
    uVar19 = 1;
    pmVar24 = (mapped_type *)(ulong)uVar26;
    if (uVar27 == 0) {
      pmVar24 = (mapped_type *)0x0;
      uVar18 = 0;
      do {
        uVar19 = uVar18 & 0x1f;
        uVar18 = uVar18 + 1;
        if ((local_1078->access_mask >> uVar19 & 1) != 0) {
          pmVar24 = (mapped_type *)(ulong)uVar18;
        }
        uVar19 = (uint)pmVar24;
      } while (uVar18 != 4);
    }
    local_1068.type = (Type *)0x0;
    local_1068.kind = Argument;
    local_1068._12_4_ = 0;
    if (TVar6 == DoubleTyID) {
      IVar5 = spv::Builder::makeFloatType
                        (this,*(int *)(&DAT_001c28b4 + (long)(int)(width - B16) * 4));
    }
    else {
      IVar5 = spv::Builder::makeIntegerType
                        (this,*(int *)(&DAT_001c28b4 + (long)(int)(width - B16) * 4),false);
    }
    if (uVar27 != 0) {
      IVar5 = spv::Builder::makeVectorType(this,IVar5,uVar26);
    }
    SVar2 = pmVar11->storage;
    pTVar13 = LLVMBC::Type::getStructElementType(local_1050,0);
    TVar6 = LLVMBC::Type::getTypeID(pTVar13);
    cVar25 = '\x01';
    if (TVar6 == IntegerTyID) {
      bVar3 = type_is_16bit(pTVar13);
      if ((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) {
        cVar25 = (impl->options).min_precision_prefer_native_16bit;
      }
      else {
        cVar25 = '\0';
      }
    }
    uVar26 = (uVar20 & 0x10) >> 4;
    local_1068.tween_id = (uint64_t)pTVar13;
    TVar6 = LLVMBC::Type::getTypeID(local_1088);
    if (TVar6 == DoubleTyID) {
      cVar25 = '\0';
    }
    local_1050 = (Type *)CONCAT44(local_1050._4_4_,uVar26);
    if (((byte)uVar26 & SVar2 == StorageClassStorageBuffer) == 1) {
      p_Var12 = get_thread_log_callback();
      if (p_Var12 == (LoggingCallback)0x0) {
        emit_buffer_load_instruction();
        return false;
      }
      uStack_1018 = 0x62;
      uStack_1017 = 0x6361;
      uStack_1015 = 0x283a3e202e6b;
      uStack_100f = 10;
      local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x61707320646e6120;
      uStack_1020 = 0x72;
      uStack_101f = 0x6573;
      uStack_101d = 0x6465656620;
      uVar28._0_1_ = 's';
      uVar28._1_1_ = 'e';
      uVar28._2_1_ = ' ';
      uVar28._3_1_ = 'S';
      uVar29._0_1_ = 'S';
      uVar29._1_1_ = 'B';
      uVar29._2_1_ = 'O';
      uVar29._3_1_ = 's';
      goto LAB_0017384d;
    }
    uVar26 = (uint)pmVar24;
    if (SVar2 == StorageClassStorageBuffer) {
      IVar7 = spv::Builder::makePointer(this,StorageClassStorageBuffer,IVar5);
      pmVar11 = local_1098;
      local_1080 = (mapped_type *)CONCAT44(local_1080._4_4_,IVar7);
      if (uVar19 != 0) {
        local_1088 = (Type *)(ulong)uVar19;
        pTVar13 = (Type *)0x0;
        do {
          if ((uVar27 == 0) && ((local_1078->access_mask >> ((uint)pTVar13 & 0x1f) & 1) == 0)) {
            IVar7 = spv::Builder::createUndefined(this,IVar5);
          }
          else {
            pOVar15 = Converter::Impl::allocate(impl,OpAccessChain,(Id)local_1080);
            Operation::add_id(pOVar15,local_109c);
            IVar7 = spv::Builder::makeIntegerType(this,0x20,false);
            IVar7 = spv::Builder::makeIntConstant(this,IVar7,0,false);
            Operation::add_id(pOVar15,IVar7);
            IVar7 = Converter::Impl::build_offset(impl,local_1048.index_id,(uint)pTVar13);
            Operation::add_id(pOVar15,IVar7);
            Converter::Impl::add(impl,pOVar15,false);
            if (pmVar11->non_uniform == true) {
              spv::Builder::addDecoration(this,pOVar15->id,DecorationNonUniform,-1);
            }
            pOVar17 = Converter::Impl::allocate(impl,OpLoad,IVar5);
            Operation::add_id(pOVar17,pOVar15->id);
            Converter::Impl::add(impl,pOVar17,pmVar11->rov);
            IVar7 = pOVar17->id;
          }
          *(Id *)((long)&local_1068.type + (long)pTVar13 * 4) = IVar7;
          pTVar13 = (Type *)((long)&pTVar13->context + 1);
        } while (local_1088 != pTVar13);
      }
      if (uVar27 == 0) {
        IVar5 = Converter::Impl::build_vector(impl,IVar5,(Id *)&local_1068,uVar26);
        pTVar13 = (Type *)local_1068.tween_id;
      }
      else {
        pTVar13 = (Type *)local_1068.tween_id;
        IVar5 = (Id)local_1068.type;
      }
LAB_00173d6f:
      if ((uVar20 & 0x10) != 0) goto LAB_00173eab;
    }
    else {
      bVar3 = spv::Builder::isStorageImageType(this,(Id)local_1080);
      local_106c = spv::Builder::makeVectorType(this,IVar5,4);
      IVar7 = 0;
      local_1070 = 0;
      if ((uVar20 & 0x10) != 0) {
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_start = (pointer)allocate_in_thread(8);
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_finish =
             &(((CallInst *)
               local_1038.
               super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.kind;
        *(Id *)&(((CallInst *)
                 local_1038.
                 super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.type =
             IVar5;
        *(Id *)((long)&(((CallInst *)
                        local_1038.
                        super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start)->super_Instruction).super_Value.
                       type + 4) = local_106c;
        local_1038.super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             local_1038.
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        local_1070 = Converter::Impl::get_struct_type(impl,&local_1038,0,"SparseTexel");
        if ((CallInst *)
            local_1038.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (CallInst *)0x0) {
          free_in_thread(local_1038.
                         super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                         ._M_impl.super__Vector_impl_data._M_start);
        }
      }
      if (uVar26 != 0) {
        bVar4 = 1;
        lVar22 = 0;
        IVar7 = 0;
        local_1080 = pmVar24;
        do {
          if ((local_1078->access_mask >> ((uint)lVar22 & 0x1f) & 1) == 0) {
            IVar8 = spv::Builder::makeIntegerType(this,0x20,false);
            IVar8 = spv::Builder::createUndefined(this,IVar8);
          }
          else {
            bVar4 = bVar4 & (byte)local_1050;
            local_1088 = (Type *)CONCAT71(local_1088._1_7_,bVar4);
            OVar23 = OpImageRead;
            if (bVar4 != 0) {
              OVar23 = OpImageSparseRead;
            }
            IVar8 = local_106c;
            op = OpImageFetch;
            if (bVar4 != 0) {
              IVar8 = local_1070;
              op = OpImageSparseFetch;
            }
            if (bVar3) {
              op = OVar23;
            }
            pOVar15 = Converter::Impl::allocate(impl,op,IVar8);
            local_1040._0_4_ = local_109c;
            local_1040._4_4_ = Converter::Impl::build_offset(impl,local_1048.index_id,(uint)lVar22);
            local_1038.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)local_1040;
            local_1038.
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish = (ValueKind *)0x2;
            Operation::add_ids(pOVar15,(initializer_list<unsigned_int> *)&local_1038);
            Converter::Impl::add(impl,pOVar15,local_1098->rov);
            pOVar17 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
            Operation::add_id(pOVar17,pOVar15->id);
            Operation::add_literal(pOVar17,0);
            Converter::Impl::add(impl,pOVar17,false);
            IVar8 = pOVar17->id;
            if ((char)local_1088 == '\x01') {
              pOVar17 = Converter::Impl::allocate(impl,OpCompositeExtract,IVar5);
              Operation::add_id(pOVar17,pOVar15->id);
              Operation::add_literal(pOVar17,1);
              bVar4 = 0;
              Operation::add_literal(pOVar17,0);
              Converter::Impl::add(impl,pOVar17,false);
              IVar7 = IVar8;
              IVar8 = pOVar17->id;
            }
            else {
              bVar4 = 0;
            }
          }
          *(Id *)((long)&local_1068.type + lVar22 * 4) = IVar8;
          lVar22 = lVar22 + 1;
        } while (local_1080 != (mapped_type *)lVar22);
      }
      if ((uVar20 & 0x10) != 0) {
        pOVar15 = Converter::Impl::allocate(impl,OpCompositeConstruct,(Value *)local_1090);
        pTVar13 = (Type *)local_1068.tween_id;
        if ((cVar25 != '\0') && (uVar26 != 0)) {
          lVar22 = 0;
          local_1098 = pmVar24;
          do {
            IVar5 = Converter::Impl::get_type_id(impl,pTVar13,0);
            pOVar17 = Converter::Impl::allocate(impl,OpBitcast,IVar5);
            Operation::add_id(pOVar17,*(Id *)((long)&local_1068.type + lVar22 * 4));
            Converter::Impl::add(impl,pOVar17,false);
            *(Id *)((long)&local_1068.type + lVar22 * 4) = pOVar17->id;
            lVar22 = lVar22 + 1;
          } while (local_1098 != (mapped_type *)lVar22);
        }
        if (uVar26 == 0) {
LAB_00173cc4:
          iVar21 = uVar26 - 4;
          do {
            IVar5 = Converter::Impl::get_type_id(impl,pTVar13,0);
            IVar5 = spv::Builder::createUndefined(this,IVar5);
            Operation::add_id(pOVar15,IVar5);
            iVar21 = iVar21 + 1;
          } while (iVar21 != 0);
        }
        else {
          lVar22 = 0;
          do {
            Operation::add_id(pOVar15,*(Id *)((long)&local_1068.type + lVar22 * 4));
            lVar22 = lVar22 + 1;
          } while (pmVar24 != (mapped_type *)lVar22);
          if (uVar26 < 4) goto LAB_00173cc4;
        }
        Operation::add_id(pOVar15,IVar7);
        Converter::Impl::add(impl,pOVar15,false);
        IVar5 = 0;
        goto LAB_00173d6f;
      }
      IVar5 = Converter::Impl::build_vector(impl,IVar5,(Id *)&local_1068,uVar26);
      pTVar13 = (Type *)local_1068.tween_id;
    }
    instruction = local_1090;
    if (cVar25 != '\0') {
      bVar3 = type_is_16bit(pTVar13);
      if (((bVar3) && ((impl->execution_mode_meta).native_16bit_operations == false)) &&
         ((impl->options).min_precision_prefer_native_16bit == true)) {
        TVar6 = LLVMBC::Type::getTypeID(pTVar13);
        if (TVar6 == HalfTyID) {
          IVar7 = Converter::Impl::get_type_id(impl,F32,1,uVar26,false);
          pOVar15 = Converter::Impl::allocate(impl,OpBitcast,IVar7);
          Operation::add_id(pOVar15,IVar5);
          Converter::Impl::add(impl,pOVar15,false);
          IVar5 = pOVar15->id;
          IVar7 = Converter::Impl::get_type_id(impl,F16,1,uVar26,false);
          OVar23 = OpFConvert;
        }
        else {
          IVar7 = Converter::Impl::get_type_id(impl,U16,1,uVar26,false);
          OVar23 = OpUConvert;
        }
      }
      else {
        IVar7 = Converter::Impl::get_type_id(impl,pTVar13,0);
        IVar7 = Converter::Impl::build_vector_type(impl,IVar7,uVar26);
        OVar23 = OpBitcast;
      }
      pOVar15 = Converter::Impl::allocate(impl,OVar23,IVar7);
      Operation::add_id(pOVar15,IVar5);
      Converter::Impl::add(impl,pOVar15,false);
      IVar5 = pOVar15->id;
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar5);
  }
  build_exploded_composite_from_vector(impl,&instruction->super_Instruction,uVar26);
LAB_00173eab:
  local_1078->forced_composite = false;
  return true;
}

Assistant:

bool emit_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction)
{
	if (impl.ags.num_instructions == 1)
	{
		if (instruction->getOperand(2) == impl.ags.backdoor_instructions[0])
		{
			impl.ags.active_uav_ptr = impl.get_id_for_value(instruction->getOperand(1));
			impl.ags.active_uav_op = DXIL::Op::BufferLoad;
			impl.ags.active_read_backdoor = instruction;
			return true;
		}
	}

	// Elide dead loads.
	if (!impl.composite_is_accessed(instruction))
		return true;

	auto &builder = impl.builder();
	spv::Id image_id = impl.get_id_for_value(instruction->getOperand(1));
	spv::Id image_type_id = impl.get_type_id(image_id);
	const auto &meta = impl.handle_to_resource_meta[image_id];

	auto &access_meta = impl.llvm_composite_meta[instruction];
	bool sparse = (access_meta.access_mask & (1u << 4)) != 0;

	// Leave no gaps in the access mask to aid vectorization.
	// For reads, we can safely read components we not strictly need to read.
	uint32_t smeared_access_mask;

	if (meta.storage != spv::StorageClassUniformConstant)
	{
		smeared_access_mask = access_meta.access_mask & 0xfu;
		smeared_access_mask |= smeared_access_mask >> 1u;
		smeared_access_mask |= smeared_access_mask >> 2u;
	}
	else
		smeared_access_mask = 1;

	if (meta.storage == spv::StorageClassPhysicalStorageBuffer)
	{
		if (sparse)
		{
			LOGE("Cannot use BDA and sparse feedback. >:(\n");
			return false;
		}

		// We don't know more about alignment in SM 5.1 BufferStore.
		// We know the type must be 32-bit however ...
		// Might be possible to do some fancy analysis to deduce a better alignment.

		return emit_physical_buffer_load_instruction(impl, instruction, meta.physical_pointer_meta,
		                                             smeared_access_mask, 4);
	}

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	bool raw_access_chain = buffer_access_is_raw_access_chain(impl, meta) && !sparse;
	if (raw_access_chain)
		return emit_buffer_load_raw_chain_instruction(impl, instruction, meta, access_meta);

	auto *result_type = instruction->getType();
	auto *target_type = result_type->getStructElementType(0);

	bool is_typed = meta.kind == DXIL::ResourceKind::TypedBuffer;
	auto access = build_buffer_access(impl, instruction, 0, meta.index_offset_id,
	                                  result_type->getStructElementType(0),
	                                  smeared_access_mask);

	auto width = get_buffer_access_bits_per_component(impl, meta.storage, target_type);
	RawType raw_type = target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID ?
	                   RawType::Float : RawType::Integer;

	image_id = get_buffer_alias_handle(impl, meta, image_id, raw_type, width, access.raw_vec_size);
	bool vectorized_load = access.raw_vec_size != RawVecSize::V1;

	// Sparse information is stored in the 5th component.
	if (sparse)
		builder.addCapability(spv::CapabilitySparseResidency);

	if (!is_typed)
	{
		// Unroll up to 4 loads. Ideally, we'd probably use physical_storage_buffer here, but unfortunately we have no indication
		// how many components we need to load here, and the number of components we load is not necessarily constant,
		// so we cannot reliably encode this information in the SRV.
		// The best we can do is to infer it from stride if we can.
		//unsigned conservative_num_elements = std::min(access.num_components, std::min(4u, access_meta.components));
		unsigned conservative_num_elements = 0;
		unsigned vecsize = raw_vecsize_to_vecsize(access.raw_vec_size);

		if (vectorized_load)
			conservative_num_elements = vecsize;
		else
		{
			for (unsigned i = 0; i < 4; i++)
				if ((access_meta.access_mask & (1u << i)) != 0)
					conservative_num_elements = i + 1;
		}

		spv::Id component_ids[4] = {};

		spv::Id extracted_id_type = raw_type == RawType::Integer ?
		                            builder.makeUintType(raw_width_to_bits(width)) :
		                            builder.makeFloatType(raw_width_to_bits(width));

		if (vectorized_load)
			extracted_id_type = builder.makeVectorType(extracted_id_type, vecsize);

		spv::Id constructed_id = 0;
		bool ssbo = meta.storage == spv::StorageClassStorageBuffer;

		auto *element_type = result_type->getStructElementType(0);
		bool need_cast = (element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID) ||
		                 (type_is_16bit(element_type) && !impl.execution_mode_meta.native_16bit_operations &&
		                  impl.options.min_precision_prefer_native_16bit);

		// FP64 is handled directly.
		if (target_type->getTypeID() == llvm::Type::TypeID::DoubleTyID)
			need_cast = false;

		if (ssbo && sparse)
		{
			LOGE("Cannot use SSBOs and sparse feedback. >:(\n");
			return false;
		}

		if (ssbo)
		{
			spv::Id ptr_type = builder.makePointer(spv::StorageClassStorageBuffer, extracted_id_type);
			for (unsigned i = 0; i < (vectorized_load ? 1 : conservative_num_elements); i++)
			{
				if (vectorized_load || (access_meta.access_mask & (1u << i)) != 0)
				{
					auto *chain_op = impl.allocate(spv::OpAccessChain, ptr_type);
					chain_op->add_id(image_id);
					chain_op->add_id(builder.makeUintConstant(0));
					chain_op->add_id(impl.build_offset(access.index_id, i));
					impl.add(chain_op);

					if (meta.non_uniform)
						builder.addDecoration(chain_op->id, spv::DecorationNonUniform);

					auto *load_op = impl.allocate(spv::OpLoad, extracted_id_type);
					load_op->add_id(chain_op->id);
					impl.add(load_op, meta.rov);
					component_ids[i] = load_op->id;
				}
				else
					component_ids[i] = builder.createUndefined(extracted_id_type);
			}

			if (vectorized_load)
				constructed_id = component_ids[0];
			else
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
		}
		else
		{
			bool is_uav = builder.isStorageImageType(image_type_id);

			spv::Id loaded_id_type = builder.makeVectorType(extracted_id_type, 4);
			spv::Id sparse_code_id = 0;
			spv::Id sparse_loaded_id_type = 0;
			if (sparse)
				sparse_loaded_id_type = impl.get_struct_type({ extracted_id_type, loaded_id_type }, 0, "SparseTexel");

			bool first_load = true;
			for (unsigned i = 0; i < conservative_num_elements; i++)
			{
				if (access_meta.access_mask & (1u << i))
				{
					// There is no sane way to combine sparse feedback code, since it's completely opaque to application.
					// We could hypothetically return a vector of status code and deal with it magically, but let's not go there ...
					spv::Op opcode;
					if (is_uav)
						opcode = (sparse && first_load) ? spv::OpImageSparseRead : spv::OpImageRead;
					else
						opcode = (sparse && first_load) ? spv::OpImageSparseFetch : spv::OpImageFetch;

					Operation *loaded_op =
					    impl.allocate(opcode, (sparse && first_load) ? sparse_loaded_id_type : loaded_id_type);
					loaded_op->add_ids({ image_id, impl.build_offset(access.index_id, i) });
					impl.add(loaded_op, meta.rov);

					if (sparse && first_load)
					{
						auto *code_extract_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						code_extract_op->add_id(loaded_op->id);
						code_extract_op->add_literal(0);
						impl.add(code_extract_op);
						sparse_code_id = code_extract_op->id;

						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(1);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					else
					{
						Operation *extracted_op = impl.allocate(spv::OpCompositeExtract, extracted_id_type);
						extracted_op->add_id(loaded_op->id);
						extracted_op->add_literal(0);
						impl.add(extracted_op);
						component_ids[i] = extracted_op->id;
					}
					first_load = false;
				}
				else
					component_ids[i] = builder.createUndefined(builder.makeUintType(32));
			}

			if (sparse)
			{
				Operation *op = impl.allocate(spv::OpCompositeConstruct, instruction);

				if (need_cast)
				{
					for (unsigned i = 0; i < conservative_num_elements; i++)
					{
						auto *bitcast_op =
						    impl.allocate(spv::OpBitcast, impl.get_type_id(element_type));
						bitcast_op->add_id(component_ids[i]);
						impl.add(bitcast_op);
						component_ids[i] = bitcast_op->id;
					}
				}

				for (unsigned i = 0; i < conservative_num_elements; i++)
					op->add_id(component_ids[i]);
				for (unsigned i = conservative_num_elements; i < 4; i++)
					op->add_id(builder.createUndefined(impl.get_type_id(element_type)));
				op->add_id(sparse_code_id);
				impl.add(op);
			}
			else
			{
				constructed_id = impl.build_vector(extracted_id_type, component_ids, conservative_num_elements);
			}
		}

		if (!sparse)
		{
			if (need_cast)
			{
				spv::Id casted_id;

				if (type_is_16bit(element_type) &&
				    !impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit)
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *bitcast_op = impl.allocate(
							spv::OpBitcast,
							impl.get_type_id(DXIL::ComponentType::F32, 1, conservative_num_elements));
						bitcast_op->add_id(constructed_id);
						impl.add(bitcast_op);
						casted_id = bitcast_op->id;

						Operation *narrow_op = impl.allocate(
							spv::OpFConvert,
							impl.get_type_id(DXIL::ComponentType::F16, 1, conservative_num_elements));
						narrow_op->add_id(casted_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
					else
					{
						Operation *narrow_op = impl.allocate(
							spv::OpUConvert,
							impl.get_type_id(DXIL::ComponentType::U16, 1, conservative_num_elements));
						narrow_op->add_id(constructed_id);
						impl.add(narrow_op);
						casted_id = narrow_op->id;
					}
				}
				else
				{
					Operation *op = impl.allocate(
						spv::OpBitcast, impl.build_vector_type(impl.get_type_id(element_type), conservative_num_elements));
					op->add_id(constructed_id);
					impl.add(op);
					casted_id = op->id;
				}

				impl.rewrite_value(instruction, casted_id);
			}
			else
				impl.rewrite_value(instruction, constructed_id);

			build_exploded_composite_from_vector(impl, instruction, conservative_num_elements);
		}

		access_meta.forced_composite = false;
	}
	else
	{
		bool is_uav = builder.isStorageImageType(image_type_id);

		auto effective_component_type = Converter::Impl::get_effective_typed_resource_type(meta.component_type);
		spv::Id texel_type = impl.get_type_id(effective_component_type, 1, 4);
		spv::Id sample_type;

		if (sparse)
			sample_type = impl.get_struct_type({ builder.makeUintType(32), texel_type }, 0, "SparseTexel");
		else
			sample_type = texel_type;

		spv::Op opcode;
		if (is_uav)
			opcode = sparse ? spv::OpImageSparseRead : spv::OpImageRead;
		else
			opcode = sparse ? spv::OpImageSparseFetch : spv::OpImageFetch;

		Operation *op = impl.allocate(opcode, instruction, sample_type);

		if (!sparse)
			impl.decorate_relaxed_precision(instruction->getType()->getStructElementType(0), op->id, true);

		op->add_ids({ image_id, access.index_id });
		impl.add(op, meta.rov);

		if (sparse)
			impl.repack_sparse_feedback(meta.component_type, 4, instruction, target_type);
		else
		{
			impl.fixup_load_type_typed(meta.component_type, 4, instruction, target_type);
			build_exploded_composite_from_vector(impl, instruction, 4);
		}
	}

	return true;
}